

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptlinux.c
# Opt level: O0

PtError Pt_Start(int resolution,PtCallback *callback,void *userData)

{
  int iVar1;
  int *__arg;
  pt_callback_parameters *parms;
  int res;
  void *userData_local;
  PtCallback *callback_local;
  int resolution_local;
  
  if (time_started_flag != 0) {
    return ptNoError;
  }
  ftime(&time_offset);
  if (callback != (PtCallback *)0x0) {
    __arg = (int *)malloc(0x18);
    if (__arg == (int *)0x0) {
      return ptInsufficientMemory;
    }
    *__arg = pt_callback_proc_id;
    __arg[1] = resolution;
    *(PtCallback **)(__arg + 2) = callback;
    *(void **)(__arg + 4) = userData;
    iVar1 = pthread_create(&pt_thread_pid,(pthread_attr_t *)0x0,Pt_CallbackProc,__arg);
    if (iVar1 != 0) {
      return ptHostError;
    }
    pt_thread_created = 1;
  }
  time_started_flag = 1;
  return ptNoError;
}

Assistant:

PtError Pt_Start(int resolution, PtCallback *callback, void *userData)
{
    if (time_started_flag) return ptNoError;
    ftime(&time_offset); /* need this set before process runs */
    if (callback) {
        int res;
        pt_callback_parameters *parms = (pt_callback_parameters *) 
            malloc(sizeof(pt_callback_parameters));
        if (!parms) return ptInsufficientMemory;
        parms->id = pt_callback_proc_id;
        parms->resolution = resolution;
        parms->callback = callback;
        parms->userData = userData;
        res = pthread_create(&pt_thread_pid, NULL, 
                             Pt_CallbackProc, parms);
        if (res != 0) return ptHostError;
        pt_thread_created = TRUE;
    }
    time_started_flag = TRUE;
    return ptNoError;
}